

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::Calc_Sxi_eta_compact
          (ChElementHexaANCF_3843 *this,VectorN *Sxi_eta_compact,double xi,double eta,double zeta)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar19 [64];
  undefined1 in_register_00001288 [56];
  undefined1 auVar20 [64];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  auVar20._8_56_ = in_register_00001288;
  auVar20._0_8_ = zeta;
  auVar19._8_56_ = in_register_00001248;
  auVar19._0_8_ = eta;
  auVar16._8_56_ = in_register_00001208;
  auVar16._0_8_ = xi;
  auVar14 = auVar20._0_16_;
  auVar4 = vaddsd_avx512f(auVar14,ZEXT816(0xbff0000000000000));
  dVar21 = auVar4._0_8_;
  auVar5 = vaddsd_avx512f(auVar16._0_16_,ZEXT816(0xbff0000000000000));
  dVar22 = auVar5._0_8_;
  auVar17 = auVar19._0_16_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = eta * 3.0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = xi * xi;
  auVar15 = vfmadd231sd_fma(auVar12,auVar17,auVar6);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar15._0_8_ + xi;
  auVar18 = vfmadd231sd_fma(auVar11,auVar14,auVar14);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar18._0_8_ + zeta;
  auVar6 = vaddsd_avx512f(auVar10,ZEXT816(0xc008000000000000));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar21 * 0.0625 * dVar22;
  auVar7 = vmulsd_avx512f(auVar8,auVar6);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0] = auVar7._0_8_;
  auVar8 = vaddsd_avx512f(auVar16._0_16_,ZEXT816(0x3ff0000000000000));
  dVar24 = auVar8._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[1] = this->m_lenX * 0.03125 * dVar24 * dVar22 * dVar22 * dVar21;
  auVar9 = vfmadd213sd_avx512f(ZEXT816(0x4008000000000000),auVar17,ZEXT816(0x3ff0000000000000));
  dVar26 = auVar9._0_8_;
  auVar10 = vaddsd_avx512f(auVar17,ZEXT816(0xbff0000000000000));
  dVar27 = auVar10._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[2] = dVar27 * dVar26 * this->m_lenY * 0.03125 * dVar21 * dVar22;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = this->m_lenZ;
  auVar7 = vmulsd_avx512f(ZEXT816(0x3fa0000000000000),auVar7);
  auVar11 = vaddsd_avx512f(auVar14,ZEXT816(0x3ff0000000000000));
  auVar7 = vmulsd_avx512f(auVar11,auVar7);
  auVar7 = vmulsd_avx512f(auVar4,auVar7);
  auVar7 = vmulsd_avx512f(auVar4,auVar7);
  auVar7 = vmulsd_avx512f(auVar5,auVar7);
  pdVar1 = (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 3;
  vmovsd_avx512f(auVar7);
  *pdVar1 = *pdVar1;
  auVar12 = vmulsd_avx512f(auVar4,ZEXT816(0xbfb0000000000000));
  auVar13 = vmulsd_avx512f(auVar8,auVar12);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar15._0_8_ - xi;
  auVar7 = vfmadd231sd_fma(auVar30,auVar14,auVar14);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar7._0_8_ + zeta;
  auVar14 = vaddsd_avx512f(auVar14,ZEXT816(0xc008000000000000));
  auVar15 = vmulsd_avx512f(auVar13,auVar14);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[4] = auVar15._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[5] = dVar21 * dVar24 * dVar24 * dVar22 * this->m_lenX * 0.03125;
  auVar13 = ZEXT816(0xbfa0000000000000);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = this->m_lenY;
  auVar15 = vmulsd_avx512f(auVar13,auVar15);
  auVar15 = vmulsd_avx512f(auVar9,auVar15);
  auVar15 = vmulsd_avx512f(auVar10,auVar15);
  auVar15 = vmulsd_avx512f(auVar4,auVar15);
  auVar15 = vmulsd_avx512f(auVar8,auVar15);
  pdVar1 = (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 6;
  vmovsd_avx512f(auVar15);
  *pdVar1 = *pdVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this->m_lenZ;
  auVar15 = vmulsd_avx512f(auVar13,auVar9);
  auVar15 = vmulsd_avx512f(auVar11,auVar15);
  auVar15 = vmulsd_avx512f(auVar4,auVar15);
  auVar15 = vmulsd_avx512f(auVar4,auVar15);
  auVar15 = vmulsd_avx512f(auVar8,auVar15);
  pdVar1 = (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 7;
  vmovsd_avx512f(auVar15);
  *pdVar1 = *pdVar1;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar21 * 0.0625 * dVar24;
  auVar15 = vmulsd_avx512f(auVar29,auVar14);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[8] = auVar15._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[9] = this->m_lenX * -0.03125 * dVar22 * dVar24 * dVar24 * dVar21;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->m_lenY;
  auVar15 = vmulsd_avx512f(auVar13,auVar4);
  auVar9 = vaddsd_avx512f(auVar17,ZEXT816(0x3ff0000000000000));
  auVar15 = vmulsd_avx512f(auVar9,auVar15);
  auVar4 = vfmadd213sd_avx512f(ZEXT816(0x4008000000000000),auVar17,ZEXT816(0xbff0000000000000));
  auVar15 = vmulsd_avx512f(auVar4,auVar15);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[10] = dVar24 * dVar21 * auVar15._0_8_;
  dVar25 = auVar11._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0xb] = dVar24 * dVar21 * dVar21 * dVar25 * this->m_lenZ * 0.03125;
  auVar15 = vmulsd_avx512f(auVar5,auVar12);
  auVar15 = vmulsd_avx512f(auVar15,auVar6);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0xc] = auVar15._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0xd] = dVar21 * dVar22 * dVar22 * dVar24 * this->m_lenX * -0.03125;
  dVar28 = auVar9._0_8_;
  dVar23 = auVar4._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0xe] = dVar22 * dVar21 * dVar23 * dVar28 * this->m_lenY * 0.03125;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0xf] = dVar22 * dVar21 * dVar21 * dVar25 * this->m_lenZ * -0.03125;
  auVar15 = vmulsd_avx512f(auVar11,ZEXT816(0xbfb0000000000000));
  auVar9 = vmulsd_avx512f(auVar5,auVar15);
  dVar2 = (auVar18._0_8_ - zeta) + -3.0;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2;
  auVar9 = vmulsd_avx512f(auVar9,auVar18);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x10] = auVar9._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x11] = dVar25 * this->m_lenX * -0.03125 * dVar24 * dVar22 * dVar22;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x12] = dVar25 * dVar27 * dVar26 * this->m_lenY * -0.03125 * dVar22;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x13] = dVar25 * dVar25 * this->m_lenZ * 0.03125 * dVar21 * dVar22;
  dVar3 = (auVar7._0_8_ - zeta) + -3.0;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x14] = dVar25 * 0.0625 * dVar24 * dVar3;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x15] = dVar25 * this->m_lenX * -0.03125 * dVar22 * dVar24 * dVar24;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x16] = dVar25 * dVar27 * dVar26 * this->m_lenY * 0.03125 * dVar24;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x17] = dVar25 * dVar25 * this->m_lenZ * -0.03125 * dVar21 * dVar24;
  auVar7 = vmulsd_avx512f(auVar8,auVar15);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x18] = auVar7._0_8_ * dVar3;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x19] = dVar25 * dVar24 * dVar24 * dVar22 * this->m_lenX * 0.03125;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x1a] = dVar24 * dVar25 * dVar23 * dVar28 * this->m_lenY * 0.03125;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x1b] = dVar24 * dVar25 * dVar25 * dVar21 * this->m_lenZ * 0.03125;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x1c] = dVar25 * 0.0625 * dVar22 * dVar2;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x1d] = dVar25 * dVar22 * dVar22 * dVar24 * this->m_lenX * 0.03125;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x1e] = dVar22 * dVar25 * dVar23 * dVar28 * this->m_lenY * -0.03125;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x1f] = dVar22 * dVar25 * dVar25 * dVar21 * this->m_lenZ * -0.03125;
  return;
}

Assistant:

void ChElementHexaANCF_3843::Calc_Sxi_eta_compact(VectorN& Sxi_eta_compact, double xi, double eta, double zeta) {
    Sxi_eta_compact(0) = 0.0625 * (zeta - 1) * (xi - 1) * (3 * eta * eta + xi * xi + xi + zeta * zeta + zeta - 3);
    Sxi_eta_compact(1) = 0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta - 1);
    Sxi_eta_compact(2) = 0.03125 * m_lenY * (3 * eta + 1) * (eta - 1) * (zeta - 1) * (xi - 1);
    Sxi_eta_compact(3) = 0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi - 1);
    Sxi_eta_compact(4) = -0.0625 * (zeta - 1) * (xi + 1) * (3 * eta * eta + xi * xi - xi + zeta * zeta + zeta - 3);
    Sxi_eta_compact(5) = 0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta - 1);
    Sxi_eta_compact(6) = -0.03125 * m_lenY * (3 * eta + 1) * (eta - 1) * (zeta - 1) * (xi + 1);
    Sxi_eta_compact(7) = -0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi + 1);
    Sxi_eta_compact(8) = 0.0625 * (zeta - 1) * (xi + 1) * (3 * eta * eta + xi * xi - xi + zeta * zeta + zeta - 3);
    Sxi_eta_compact(9) = -0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta - 1);
    Sxi_eta_compact(10) = -0.03125 * m_lenY * (eta + 1) * (3 * eta - 1) * (zeta - 1) * (xi + 1);
    Sxi_eta_compact(11) = 0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi + 1);
    Sxi_eta_compact(12) = -0.0625 * (zeta - 1) * (xi - 1) * (3 * eta * eta + xi * xi + xi + zeta * zeta + zeta - 3);
    Sxi_eta_compact(13) = -0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta - 1);
    Sxi_eta_compact(14) = 0.03125 * m_lenY * (eta + 1) * (3 * eta - 1) * (zeta - 1) * (xi - 1);
    Sxi_eta_compact(15) = -0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi - 1);
    Sxi_eta_compact(16) = -0.0625 * (zeta + 1) * (xi - 1) * (3 * eta * eta + xi * xi + xi + zeta * zeta - zeta - 3);
    Sxi_eta_compact(17) = -0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta + 1);
    Sxi_eta_compact(18) = -0.03125 * m_lenY * (3 * eta + 1) * (eta - 1) * (zeta + 1) * (xi - 1);
    Sxi_eta_compact(19) = 0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi - 1);
    Sxi_eta_compact(20) = 0.0625 * (zeta + 1) * (xi + 1) * (3 * eta * eta + xi * xi - xi + zeta * zeta - zeta - 3);
    Sxi_eta_compact(21) = -0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta + 1);
    Sxi_eta_compact(22) = 0.03125 * m_lenY * (3 * eta + 1) * (eta - 1) * (zeta + 1) * (xi + 1);
    Sxi_eta_compact(23) = -0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi + 1);
    Sxi_eta_compact(24) = -0.0625 * (zeta + 1) * (xi + 1) * (3 * eta * eta + xi * xi - xi + zeta * zeta - zeta - 3);
    Sxi_eta_compact(25) = 0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta + 1);
    Sxi_eta_compact(26) = 0.03125 * m_lenY * (eta + 1) * (3 * eta - 1) * (zeta + 1) * (xi + 1);
    Sxi_eta_compact(27) = 0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi + 1);
    Sxi_eta_compact(28) = 0.0625 * (zeta + 1) * (xi - 1) * (3 * eta * eta + xi * xi + xi + zeta * zeta - zeta - 3);
    Sxi_eta_compact(29) = 0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta + 1);
    Sxi_eta_compact(30) = -0.03125 * m_lenY * (eta + 1) * (3 * eta - 1) * (zeta + 1) * (xi - 1);
    Sxi_eta_compact(31) = -0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi - 1);
}